

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_parser.hpp
# Opt level: O0

Boxed_Value
chaiscript::parser::
ChaiScript_Parser<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>,_chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,_chaiscript::optimizer::Unused_Return,_chaiscript::optimizer::Constant_Fold,_chaiscript::optimizer::If,_chaiscript::optimizer::Return,_chaiscript::optimizer::Dead_Code,_chaiscript::optimizer::Block,_chaiscript::optimizer::For_Loop,_chaiscript::optimizer::Assign_Decl>,_512UL>
::buildFloat(string_view t_val)

{
  const_reference pvVar1;
  element_type *this;
  Boxed_Value BVar3;
  basic_string_view<char,_std::char_traits<char>_> bVar4;
  string_view t_str;
  string_view t_str_00;
  string_view t_str_01;
  chaiscript *local_80;
  type_conflict1 local_70;
  basic_string_view<char,_std::char_traits<char>_> local_68;
  longdouble local_58;
  basic_string_view<char,_std::char_traits<char>_> local_48;
  type_conflict2 local_38;
  char local_31;
  size_type sStack_30;
  char val;
  size_type i;
  undefined1 auStack_20 [6];
  bool long_;
  bool float_;
  string_view t_val_local;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  
  _auStack_20 = t_val._M_str;
  this = (element_type *)t_val._M_len;
  i._7_1_ = 0;
  i._6_1_ = 0;
  t_val_local._M_str = (char *)this;
  for (sStack_30 = std::basic_string_view<char,_std::char_traits<char>_>::size
                             ((basic_string_view<char,_std::char_traits<char>_> *)auStack_20);
      sStack_30 != 0; sStack_30 = sStack_30 - 1) {
    pvVar1 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                       ((basic_string_view<char,_std::char_traits<char>_> *)auStack_20,sStack_30 - 1
                       );
    local_31 = *pvVar1;
    if ((local_31 == 'f') || (local_31 == 'F')) {
      i._7_1_ = 1;
    }
    else {
      if ((local_31 != 'l') && (local_31 != 'L')) break;
      i._6_1_ = 1;
    }
  }
  if ((i._7_1_ & 1) == 0) {
    if ((i._6_1_ & 1) == 0) {
      bVar4 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                        ((basic_string_view<char,_std::char_traits<char>_> *)auStack_20,0,sStack_30)
      ;
      t_str_01._M_str = bVar4._M_str;
      local_80 = (chaiscript *)bVar4._M_len;
      t_str_01._M_len = (size_t)t_str_01._M_str;
      local_70 = parse_num<double>(local_80,t_str_01);
      BVar3 = const_var<double>((chaiscript *)this,&local_70);
      _Var2._M_pi = BVar3.m_data.
                    super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi;
    }
    else {
      local_68 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                           ((basic_string_view<char,_std::char_traits<char>_> *)auStack_20,0,
                            sStack_30);
      t_str_00._M_str = local_68._M_str;
      t_str_00._M_len = (size_t)t_str_00._M_str;
      parse_num<long_double>((type_conflict3 *)local_68._M_len,t_str_00);
      BVar3 = const_var<long_double>((chaiscript *)this,&local_58);
      _Var2._M_pi = BVar3.m_data.
                    super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi;
    }
  }
  else {
    local_48 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                         ((basic_string_view<char,_std::char_traits<char>_> *)auStack_20,0,sStack_30
                         );
    t_str._M_str = local_48._M_str;
    t_str._M_len = (size_t)t_str._M_str;
    local_38 = parse_num<float>((chaiscript *)local_48._M_len,t_str);
    BVar3 = const_var<float>((chaiscript *)this,&local_38);
    _Var2._M_pi = BVar3.m_data.
                  super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
  }
  BVar3.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var2._M_pi;
  BVar3.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = this;
  return (Boxed_Value)
         BVar3.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static Boxed_Value buildFloat(std::string_view t_val) {
        bool float_ = false;
        bool long_ = false;

        auto i = t_val.size();

        for (; i > 0; --i) {
          char val = t_val[i - 1];

          if (val == 'f' || val == 'F') {
            float_ = true;
          } else if (val == 'l' || val == 'L') {
            long_ = true;
          } else {
            break;
          }
        }

        if (float_) {
          return const_var(parse_num<float>(t_val.substr(0, i)));
        } else if (long_) {
          return const_var(parse_num<long double>(t_val.substr(0, i)));
        } else {
          return const_var(parse_num<double>(t_val.substr(0, i)));
        }
      }